

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_compute_branch_nm
               (DisasContext_conflict6 *ctx,uint32_t opc,int insn_bytes,int rs,int rt,int32_t offset
               )

{
  TCGContext_conflict6 *tcg_ctx_00;
  TCGv_i64 t;
  TCGv_i64 t_00;
  bool bVar1;
  TCGv_i64 t1;
  TCGv_i64 t0;
  target_ulong tStack_38;
  int bcond_compute;
  target_ulong btgt;
  TCGContext_conflict6 *tcg_ctx;
  int32_t offset_local;
  int rt_local;
  int rs_local;
  int insn_bytes_local;
  uint32_t opc_local;
  DisasContext_conflict6 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  tStack_38 = 0xffffffffffffffff;
  bVar1 = false;
  t = tcg_temp_new_i64(tcg_ctx_00);
  t_00 = tcg_temp_new_i64(tcg_ctx_00);
  if (opc - 8 < 2) {
    if ((offset != 0) && (offset != 0x10)) {
      generate_exception_end(ctx,0x14);
      goto LAB_00d045a6;
    }
    gen_load_gpr(tcg_ctx_00,tcg_ctx_00->btarget,rs);
  }
  else if (opc == 0x4110000) {
    bVar1 = rs != 0;
    if (bVar1) {
      gen_load_gpr(tcg_ctx_00,t,rs);
    }
    tStack_38 = (ctx->base).pc_next + (long)insn_bytes + (long)offset;
  }
  else if (opc == 0x41c0000) {
    tcg_gen_andi_i64_mips64el(tcg_ctx_00,t,tcg_ctx_00->cpu_dspctrl,0x3f);
    bVar1 = true;
    tStack_38 = (ctx->base).pc_next + (long)insn_bytes + (long)offset;
  }
  else {
    if ((opc != 0x10000000) && (opc != 0x14000000)) {
      generate_exception_end(ctx,0x14);
      goto LAB_00d045a6;
    }
    bVar1 = rs != rt;
    if (bVar1) {
      gen_load_gpr(tcg_ctx_00,t,rs);
      gen_load_gpr(tcg_ctx_00,t_00,rt);
    }
    tStack_38 = (ctx->base).pc_next + (long)insn_bytes + (long)offset;
  }
  if (bVar1) {
    if (opc == 0x4110000) {
      tcg_gen_setcondi_i64_mips64el(tcg_ctx_00,TCG_COND_GE,tcg_ctx_00->bcond,t,0);
      tcg_gen_movi_i64_mips64el
                (tcg_ctx_00,tcg_ctx_00->cpu_gpr[0x1f],(ctx->base).pc_next + (long)insn_bytes);
    }
    else if (opc == 0x41c0000) {
      tcg_gen_setcondi_i64_mips64el(tcg_ctx_00,TCG_COND_GE,tcg_ctx_00->bcond,t,0x20);
    }
    else if (opc == 0x10000000) {
      tcg_gen_setcond_i64_mips64el(tcg_ctx_00,TCG_COND_EQ,tcg_ctx_00->bcond,t,t_00);
    }
    else {
      if (opc != 0x14000000) {
        generate_exception_end(ctx,0x14);
        goto LAB_00d045a6;
      }
      tcg_gen_setcond_i64_mips64el(tcg_ctx_00,TCG_COND_NE,tcg_ctx_00->bcond,t,t_00);
    }
    ctx->hflags = ctx->hflags | 0x1000;
  }
  else if (opc == 8) {
    ctx->hflags = ctx->hflags | 0x2000;
  }
  else if (opc == 9) {
    if (0 < rt) {
      tcg_gen_movi_i64_mips64el
                (tcg_ctx_00,tcg_ctx_00->cpu_gpr[rt],(ctx->base).pc_next + (long)insn_bytes);
    }
    ctx->hflags = ctx->hflags | 0x2000;
  }
  else if (opc == 0x4110000) {
    tcg_gen_movi_i64_mips64el
              (tcg_ctx_00,tcg_ctx_00->cpu_gpr[0x1f],(ctx->base).pc_next + (long)insn_bytes);
    ctx->hflags = ctx->hflags | 0x800;
  }
  else {
    if (opc != 0x10000000) {
      if (opc == 0x14000000) {
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[0x1f],(ctx->base).pc_next + 8);
        (ctx->base).pc_next = (ctx->base).pc_next + 4;
      }
      else {
        generate_exception_end(ctx,0x14);
      }
      goto LAB_00d045a6;
    }
    ctx->hflags = ctx->hflags | 0x800;
  }
  ctx->btarget = tStack_38;
LAB_00d045a6:
  if (insn_bytes == 2) {
    ctx->hflags = ctx->hflags | 0x4000;
  }
  tcg_temp_free_i64(tcg_ctx_00,t);
  tcg_temp_free_i64(tcg_ctx_00,t_00);
  return;
}

Assistant:

static void gen_compute_branch_nm(DisasContext *ctx, uint32_t opc,
                                int insn_bytes,
                                int rs, int rt, int32_t offset)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    target_ulong btgt = -1;
    int bcond_compute = 0;
    TCGv t0 = tcg_temp_new(tcg_ctx);
    TCGv t1 = tcg_temp_new(tcg_ctx);

    /* Load needed operands */
    switch (opc) {
    case OPC_BEQ:
    case OPC_BNE:
        /* Compare two registers */
        if (rs != rt) {
            gen_load_gpr(tcg_ctx, t0, rs);
            gen_load_gpr(tcg_ctx, t1, rt);
            bcond_compute = 1;
        }
        btgt = ctx->base.pc_next + insn_bytes + offset;
        break;
    case OPC_BGEZAL:
        /* Compare to zero */
        if (rs != 0) {
            gen_load_gpr(tcg_ctx, t0, rs);
            bcond_compute = 1;
        }
        btgt = ctx->base.pc_next + insn_bytes + offset;
        break;
    case OPC_BPOSGE32:
        tcg_gen_andi_tl(tcg_ctx, t0, tcg_ctx->cpu_dspctrl, 0x3F);
        bcond_compute = 1;
        btgt = ctx->base.pc_next + insn_bytes + offset;
        break;
    case OPC_JR:
    case OPC_JALR:
        /* Jump to register */
        if (offset != 0 && offset != 16) {
            /*
             * Hint = 0 is JR/JALR, hint 16 is JR.HB/JALR.HB, the
             * others are reserved.
             */
            MIPS_INVAL("jump hint");
            generate_exception_end(ctx, EXCP_RI);
            goto out;
        }
        gen_load_gpr(tcg_ctx, tcg_ctx->btarget, rs);
        break;
    default:
        MIPS_INVAL("branch/jump");
        generate_exception_end(ctx, EXCP_RI);
        goto out;
    }
    if (bcond_compute == 0) {
        /* No condition to be computed */
        switch (opc) {
        case OPC_BEQ:     /* rx == rx        */
            /* Always take */
            ctx->hflags |= MIPS_HFLAG_B;
            break;
        case OPC_BGEZAL:  /* 0 >= 0          */
            /* Always take and link */
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[31],
                            ctx->base.pc_next + insn_bytes);
            ctx->hflags |= MIPS_HFLAG_B;
            break;
        case OPC_BNE:     /* rx != rx        */
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[31], ctx->base.pc_next + 8);
            /* Skip the instruction in the delay slot */
            ctx->base.pc_next += 4;
            goto out;
        case OPC_JR:
            ctx->hflags |= MIPS_HFLAG_BR;
            break;
        case OPC_JALR:
            if (rt > 0) {
                tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt],
                                ctx->base.pc_next + insn_bytes);
            }
            ctx->hflags |= MIPS_HFLAG_BR;
            break;
        default:
            MIPS_INVAL("branch/jump");
            generate_exception_end(ctx, EXCP_RI);
            goto out;
        }
    } else {
        switch (opc) {
        case OPC_BEQ:
            tcg_gen_setcond_tl(tcg_ctx, TCG_COND_EQ, tcg_ctx->bcond, t0, t1);
            goto not_likely;
        case OPC_BNE:
            tcg_gen_setcond_tl(tcg_ctx, TCG_COND_NE, tcg_ctx->bcond, t0, t1);
            goto not_likely;
        case OPC_BGEZAL:
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_GE, tcg_ctx->bcond, t0, 0);
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[31],
                            ctx->base.pc_next + insn_bytes);
            goto not_likely;
        case OPC_BPOSGE32:
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_GE, tcg_ctx->bcond, t0, 32);
        not_likely:
            ctx->hflags |= MIPS_HFLAG_BC;
            break;
        default:
            MIPS_INVAL("conditional branch/jump");
            generate_exception_end(ctx, EXCP_RI);
            goto out;
        }
    }

    ctx->btarget = btgt;

 out:
    if (insn_bytes == 2) {
        ctx->hflags |= MIPS_HFLAG_B16;
    }
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
}